

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

char ** apprun_export_envp(char **envp)

{
  apprun_env_item_list_t *list;
  apprun_env_item_list_t *list_00;
  char **ppcVar1;
  
  if (envp != (char **)0x0) {
    list = apprun_env_item_list_from_envp(envp);
    list_00 = apprun_env_item_list_export(list);
    ppcVar1 = apprun_env_item_list_to_envp(list_00);
    apprun_env_item_list_free(list);
    apprun_env_item_list_free(list_00);
    return ppcVar1;
  }
  return (char **)0x0;
}

Assistant:

char **apprun_export_envp(char *const *envp) {
    if (envp == NULL)
        return NULL;

    apprun_env_item_list_t *orginial = apprun_env_item_list_from_envp(envp);
    apprun_env_item_list_t *exported = apprun_env_item_list_export(orginial);
    char **adjusted_envp = apprun_env_item_list_to_envp(exported);

    apprun_env_item_list_free(orginial);
    apprun_env_item_list_free(exported);

    return adjusted_envp;
}